

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

tribool __thiscall
libtorrent::aux::torrent::on_blocks_hashed
          (torrent *this,piece_index_t piece,span<const_libtorrent::digest32<256L>_> block_hashes)

{
  char *pcVar1;
  hash_picker *this_00;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> _Var2;
  pointer piVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  file_storage *this_01;
  char *__s;
  uint uVar8;
  value_t vVar9;
  torrent *ptVar10;
  char *pcVar11;
  digest32<256L> *pdVar13;
  char *pcVar14;
  uint uVar15;
  size_t __n;
  ulong *puVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  piece_index_t pVar21;
  set_block_hash_result sVar22;
  ulong local_98;
  ulong local_90;
  vector<int,_std::allocator<int>_> local_88;
  ulong local_70;
  digest32<256L> *local_68;
  uint local_60;
  int local_5c;
  char *local_58;
  int local_50;
  value_t local_4c;
  ulong local_48;
  size_t local_40;
  torrent *local_38;
  ulong uVar7;
  uint uVar12;
  
  pdVar13 = block_hashes.m_ptr;
  puVar16 = &local_98;
  need_hash_picker(this);
  this_01 = torrent_info::orig_files
                      ((this->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
  local_48 = (ulong)(uint)piece.m_val;
  iVar5 = file_storage::blocks_in_piece2(this_01,piece);
  local_38 = this;
  local_50 = file_storage::blocks_per_piece
                       (&((this->super_torrent_hot_members).m_torrent_file.
                          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_files);
  __n = (size_t)iVar5;
  local_90 = __n;
  if (iVar5 < 0x1001) {
    if (iVar5 < 1) {
      __n = 0;
      __s = (char *)0x0;
    }
    else {
      puVar16 = (ulong *)((long)&local_98 - (__n + 0xf & 0x1fffffff0));
      __s = (char *)puVar16;
    }
  }
  else {
    __s = (char *)operator_new__(__n);
    puVar16 = &local_98;
  }
  if (__n != 0) {
    *(char *)((long)puVar16 + -8) = -0x61;
    *(char *)((long)puVar16 + -7) = -0xe;
    *(char *)((long)puVar16 + -6) = '1';
    *(char *)((long)puVar16 + -5) = '\0';
    *(char *)((long)puVar16 + -4) = '\0';
    *(char *)((long)puVar16 + -3) = '\0';
    *(char *)((long)puVar16 + -2) = '\0';
    *(char *)((long)puVar16 + -1) = '\0';
    memset(__s,0,__n);
  }
  local_40 = __n;
  if (iVar5 < 1) {
    sVar22 = (set_block_hash_result)ZEXT812(1);
    vVar9 = indeterminate_value;
  }
  else {
    local_4c = indeterminate_value;
    uVar20 = 0;
    local_68 = pdVar13;
    local_5c = iVar5;
    local_58 = __s;
    do {
      *(char *)((long)puVar16 + -8) = -0x2c;
      *(char *)((long)puVar16 + -7) = -0xe;
      *(char *)((long)puVar16 + -6) = '1';
      *(char *)((long)puVar16 + -5) = '\0';
      *(char *)((long)puVar16 + -4) = '\0';
      *(char *)((long)puVar16 + -3) = '\0';
      *(char *)((long)puVar16 + -2) = '\0';
      *(char *)((long)puVar16 + -1) = '\0';
      bVar4 = digest32<256L>::is_all_zeros(pdVar13 + uVar20);
      uVar7 = local_48;
      if (bVar4) {
        vVar9 = false_value;
        goto LAB_0031f596;
      }
      this_00 = (local_38->super_torrent_hot_members).m_hash_picker._M_t.
                super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
                ._M_t.
                super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
                .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl;
      *(char *)((long)puVar16 + -8) = -10;
      *(char *)((long)puVar16 + -7) = -0xe;
      *(char *)((long)puVar16 + -6) = '1';
      *(char *)((long)puVar16 + -5) = '\0';
      *(char *)((long)puVar16 + -4) = '\0';
      *(char *)((long)puVar16 + -3) = '\0';
      *(char *)((long)puVar16 + -2) = '\0';
      *(char *)((long)puVar16 + -1) = '\0';
      sVar22 = hash_picker::set_block_hash
                         (this_00,(piece_index_t)(int)uVar7,(int)uVar20 << 0xe,pdVar13 + uVar20);
      uVar12 = sVar22.num_verified;
      uVar7 = sVar22._0_8_;
      if (sVar22.status == block_hash_failed) {
        local_4c = false_value;
      }
      else if (sVar22.status == success) {
        local_70 = uVar7;
        uVar15 = sVar22.first_verified_block;
        uVar8 = 0;
        if (uVar15 != 0 && -1 < (long)uVar7) {
          uVar8 = uVar15;
        }
        uVar6 = local_5c - uVar8;
        if ((int)uVar12 < (int)(local_5c - uVar8)) {
          uVar6 = uVar12;
        }
        if (0 < (int)uVar6) {
          *(char *)((long)puVar16 + -8) = '@';
          *(char *)((long)puVar16 + -7) = -0xd;
          *(char *)((long)puVar16 + -6) = '1';
          *(char *)((long)puVar16 + -5) = '\0';
          *(char *)((long)puVar16 + -4) = '\0';
          *(char *)((long)puVar16 + -3) = '\0';
          *(char *)((long)puVar16 + -2) = '\0';
          *(char *)((long)puVar16 + -1) = '\0';
          memset(__s + uVar8,1,(ulong)uVar6);
        }
        iVar5 = (int)uVar12 / local_50;
        if (iVar5 != 0) {
          local_60 = uVar12;
          iVar19 = (int)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar7 >> 0x20) /
                        (long)local_50);
          local_98 = (ulong)(uint)((int)local_48 + iVar19);
          iVar18 = 0;
          ptVar10 = local_38;
          do {
            _Var2._M_head_impl =
                 (ptVar10->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
            if ((_Var2._M_head_impl != (piece_picker *)0x0) && (-iVar19 != iVar18)) {
              pVar21.m_val = (int)local_98 + iVar18;
              *(char *)((long)puVar16 + -8) = -0x67;
              *(char *)((long)puVar16 + -7) = -0xd;
              *(char *)((long)puVar16 + -6) = '1';
              *(char *)((long)puVar16 + -5) = '\0';
              *(char *)((long)puVar16 + -4) = '\0';
              *(char *)((long)puVar16 + -3) = '\0';
              *(char *)((long)puVar16 + -2) = '\0';
              *(char *)((long)puVar16 + -1) = '\0';
              bVar4 = piece_picker::is_piece_finished(_Var2._M_head_impl,pVar21);
              ptVar10 = local_38;
              if (bVar4) {
                _Var2._M_head_impl =
                     (local_38->super_torrent_hot_members).m_picker._M_t.
                     super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                     .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
                *(char *)((long)puVar16 + -8) = -0x53;
                *(char *)((long)puVar16 + -7) = -0xd;
                *(char *)((long)puVar16 + -6) = '1';
                *(char *)((long)puVar16 + -5) = '\0';
                *(char *)((long)puVar16 + -4) = '\0';
                *(char *)((long)puVar16 + -3) = '\0';
                *(char *)((long)puVar16 + -2) = '\0';
                *(char *)((long)puVar16 + -1) = '\0';
                bVar4 = piece_picker::has_piece_passed(_Var2._M_head_impl,pVar21);
                ptVar10 = local_38;
                if (!bVar4) {
                  _Var2._M_head_impl =
                       (local_38->super_torrent_hot_members).m_picker._M_t.
                       super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                       .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
                  *(char *)((long)puVar16 + -8) = -0x3f;
                  *(char *)((long)puVar16 + -7) = -0xd;
                  *(char *)((long)puVar16 + -6) = '1';
                  *(char *)((long)puVar16 + -5) = '\0';
                  *(char *)((long)puVar16 + -4) = '\0';
                  *(char *)((long)puVar16 + -3) = '\0';
                  *(char *)((long)puVar16 + -2) = '\0';
                  *(char *)((long)puVar16 + -1) = '\0';
                  piece_picker::we_have(_Var2._M_head_impl,pVar21);
                  ptVar10 = local_38;
                  *(char *)((long)puVar16 + -8) = -0x36;
                  *(char *)((long)puVar16 + -7) = -0xd;
                  *(char *)((long)puVar16 + -6) = '1';
                  *(char *)((long)puVar16 + -5) = '\0';
                  *(char *)((long)puVar16 + -4) = '\0';
                  *(char *)((long)puVar16 + -3) = '\0';
                  *(char *)((long)puVar16 + -2) = '\0';
                  *(char *)((long)puVar16 + -1) = '\0';
                  update_gauge(ptVar10);
                  ptVar10 = local_38;
                  *(char *)((long)puVar16 + -8) = -0x28;
                  *(char *)((long)puVar16 + -7) = -0xd;
                  *(char *)((long)puVar16 + -6) = '1';
                  *(char *)((long)puVar16 + -5) = '\0';
                  *(char *)((long)puVar16 + -4) = '\0';
                  *(char *)((long)puVar16 + -3) = '\0';
                  *(char *)((long)puVar16 + -2) = '\0';
                  *(char *)((long)puVar16 + -1) = '\0';
                  we_have(ptVar10,pVar21,false);
                  ptVar10 = local_38;
                }
              }
            }
            iVar18 = iVar18 + 1;
            __s = local_58;
            uVar12 = local_60;
          } while (iVar5 != iVar18);
        }
        sVar22.num_verified = uVar12;
        sVar22.status = (undefined4)local_70;
        sVar22.first_verified_block = local_70._4_4_;
        pdVar13 = local_68;
      }
      uVar20 = uVar20 + 1;
      vVar9 = local_4c;
    } while (uVar20 != local_90);
  }
  if (sVar22.status == piece_hash_failed) {
    iVar5 = sVar22.first_verified_block / local_50;
    iVar18 = sVar22.num_verified / local_50;
    if (iVar18 != 0) {
      local_58 = __s;
      local_48 = (ulong)(uint)((int)local_48 + iVar5);
      iVar19 = 0;
      ptVar10 = local_38;
      do {
        _Var2._M_head_impl =
             (ptVar10->super_torrent_hot_members).m_picker._M_t.
             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
        if ((_Var2._M_head_impl != (piece_picker *)0x0) && (-iVar5 != iVar19)) {
          pVar21.m_val = (int)local_48 + iVar19;
          *(char *)((long)puVar16 + -8) = -0x7c;
          *(char *)((long)puVar16 + -7) = -0xc;
          *(char *)((long)puVar16 + -6) = '1';
          *(char *)((long)puVar16 + -5) = '\0';
          *(char *)((long)puVar16 + -4) = '\0';
          *(char *)((long)puVar16 + -3) = '\0';
          *(char *)((long)puVar16 + -2) = '\0';
          *(char *)((long)puVar16 + -1) = '\0';
          piece_picker::we_dont_have(_Var2._M_head_impl,pVar21);
          *(char *)((long)puVar16 + -8) = -0x74;
          *(char *)((long)puVar16 + -7) = -0xc;
          *(char *)((long)puVar16 + -6) = '1';
          *(char *)((long)puVar16 + -5) = '\0';
          *(char *)((long)puVar16 + -4) = '\0';
          *(char *)((long)puVar16 + -3) = '\0';
          *(char *)((long)puVar16 + -2) = '\0';
          *(char *)((long)puVar16 + -1) = '\0';
          update_gauge(ptVar10);
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          *(char *)((long)puVar16 + -8) = -0x56;
          *(char *)((long)puVar16 + -7) = -0xc;
          *(char *)((long)puVar16 + -6) = '1';
          *(char *)((long)puVar16 + -5) = '\0';
          *(char *)((long)puVar16 + -4) = '\0';
          *(char *)((long)puVar16 + -3) = '\0';
          *(char *)((long)puVar16 + -2) = '\0';
          *(char *)((long)puVar16 + -1) = '\0';
          piece_failed(ptVar10,pVar21,&local_88);
          piVar3 = local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          ptVar10 = local_38;
          if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            uVar20 = (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage -
                     (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
            *(char *)((long)puVar16 + -8) = -0x3d;
            *(char *)((long)puVar16 + -7) = -0xc;
            *(char *)((long)puVar16 + -6) = '1';
            *(char *)((long)puVar16 + -5) = '\0';
            *(char *)((long)puVar16 + -4) = '\0';
            *(char *)((long)puVar16 + -3) = '\0';
            *(char *)((long)puVar16 + -2) = '\0';
            *(char *)((long)puVar16 + -1) = '\0';
            operator_delete(piVar3,uVar20);
            ptVar10 = local_38;
          }
        }
        iVar19 = iVar19 + 1;
        __s = local_58;
      } while (iVar18 != iVar19);
    }
    vVar9 = false_value;
  }
  if (vVar9 != indeterminate_value) goto LAB_0031f596;
  pcVar1 = __s + local_40;
  pcVar11 = __s;
  if (0 < (long)local_40 >> 2) {
    pcVar11 = __s + (local_40 & 0xfffffffffffffffc);
    lVar17 = ((long)local_40 >> 2) + 1;
    pcVar14 = __s + 3;
    do {
      if (pcVar14[-3] != '\x01') {
        pcVar14 = pcVar14 + -3;
        goto LAB_0031f58a;
      }
      if (pcVar14[-2] != '\x01') {
        pcVar14 = pcVar14 + -2;
        goto LAB_0031f58a;
      }
      if (pcVar14[-1] != '\x01') {
        pcVar14 = pcVar14 + -1;
        goto LAB_0031f58a;
      }
      if (*pcVar14 != '\x01') goto LAB_0031f58a;
      lVar17 = lVar17 + -1;
      pcVar14 = pcVar14 + 4;
    } while (1 < lVar17);
  }
  lVar17 = (long)pcVar1 - (long)pcVar11;
  if (lVar17 == 1) {
LAB_0031f569:
    pcVar14 = pcVar11;
    if (*pcVar11 == '\x01') {
      pcVar14 = pcVar1;
    }
  }
  else if (lVar17 == 2) {
LAB_0031f561:
    pcVar14 = pcVar11;
    if (*pcVar11 == '\x01') {
      pcVar11 = pcVar11 + 1;
      goto LAB_0031f569;
    }
  }
  else {
    pcVar14 = pcVar1;
    if ((lVar17 == 3) && (pcVar14 = pcVar11, *pcVar11 == '\x01')) {
      pcVar11 = pcVar11 + 1;
      goto LAB_0031f561;
    }
  }
LAB_0031f58a:
  if (pcVar14 == pcVar1) {
    vVar9 = true_value;
  }
LAB_0031f596:
  if (__s != (char *)0x0 && 0x1000 < (long)local_40) {
    *(char *)((long)puVar16 + -8) = -0x4e;
    *(char *)((long)puVar16 + -7) = -0xb;
    *(char *)((long)puVar16 + -6) = '1';
    *(char *)((long)puVar16 + -5) = '\0';
    *(char *)((long)puVar16 + -4) = '\0';
    *(char *)((long)puVar16 + -3) = '\0';
    *(char *)((long)puVar16 + -2) = '\0';
    *(char *)((long)puVar16 + -1) = '\0';
    operator_delete__(__s);
  }
  return (tribool)vVar9;
}

Assistant:

boost::tribool torrent::on_blocks_hashed(piece_index_t const piece
		, span<sha256_hash const> const block_hashes)
	{
		boost::tribool ret = boost::indeterminate;
		need_hash_picker();

		int const blocks_in_piece = torrent_file().orig_files().blocks_in_piece2(piece);
		int const blocks_per_piece = torrent_file().blocks_per_piece();

		// the blocks are guaranteed to represent exactly one piece
		TORRENT_ASSERT(blocks_in_piece == int(block_hashes.size()));

		TORRENT_ALLOCA(block_passed, bool, blocks_in_piece);
		std::fill(block_passed.begin(), block_passed.end(), false);

		auto last_result = set_block_hash_result(set_block_hash_result::result::unknown);

		for (int i = 0; i < blocks_in_piece; ++i)
		{
			// if there was an enoent or eof error the block hashes array may be incomplete
			// bail if we've hit the end of the valid hashes
			if (block_hashes[i].is_all_zeros()) return false;

			auto const result = get_hash_picker().set_block_hash(piece
				, i * default_block_size, block_hashes[i]);
			last_result = result;

			// all verified ranges should always be full pieces or less
			TORRENT_ASSERT(result.first_verified_block >= 0
				|| (result.first_verified_block % blocks_per_piece) == 0);
			TORRENT_ASSERT(result.num_verified <= blocks_per_piece
				|| (result.num_verified % blocks_per_piece) == 0);

			if (result.status == set_block_hash_result::result::success)
			{
				TORRENT_ASSERT(result.first_verified_block < blocks_in_piece);
				TORRENT_ASSERT(blocks_in_piece <= blocks_per_piece);

				// note that result.num_verified may cover pad blocks too, and
				// so may be > blocks_in_piece

				// sometimes, completing a single block may "unlock" validating
				// multiple pieces. e.g. if we don't have the piece layer yet,
				// but we completed the last block in the whole torrent, now we
				// can validate everything. For this reason,
				// first_verified_block may be negative.

				// In this call, we track the blocks in this piece though, in
				// the block_passed array. For that tracking we need to clamp
				// the start index to 0.
				auto const first_block = std::max(0, result.first_verified_block);
				auto const count = std::min(blocks_in_piece - first_block, result.num_verified);
				std::fill_n(block_passed.begin() + first_block, count, true);

				// the current block (i) should be part of the range that was
				// verified
				TORRENT_ASSERT(first_block <= i);
				TORRENT_ASSERT(i < first_block + count);

				// if the hashes for more than one piece have been verified,
				// check for any pieces which were already checked but couldn't
				// be verified and mark them as verified
				for (piece_index_t verified_piece : result.piece_range(piece, blocks_per_piece))
				{
					if (!has_picker()
						|| verified_piece == piece
						|| !m_picker->is_piece_finished(verified_piece)
						|| m_picker->has_piece_passed(verified_piece))
						continue;

					TORRENT_ASSERT(get_hash_picker().piece_verified(verified_piece));
					m_picker->we_have(verified_piece);
					update_gauge();
					we_have(verified_piece);
				}
			}
			else if (result.status == set_block_hash_result::result::block_hash_failed)
			{
				ret = false;
			}
		}
		if (last_result.status == set_block_hash_result::result::piece_hash_failed)
		{
			// only if the *last* block causes the piece to fail, do we know
			// it actually failed. Otherwise it might have been failing
			// because of other, previously existing block hashes.
			ret = false;

			// if the hashes for more than one piece have been verified,
			// check for any pieces which were already checked but couldn't
			// be verified and mark them as verified
			for (piece_index_t verified_piece : last_result.piece_range(piece, blocks_per_piece))
			{
				if (!has_picker()
					|| verified_piece == piece)
					continue;

				m_picker->we_dont_have(verified_piece);
				update_gauge();
				piece_failed(verified_piece);
			}
		}

		if (boost::indeterminate(ret) && std::all_of(block_passed.begin(), block_passed.end()
			, [](bool e) { return e; }))
		{
			ret = true;
		}
		return ret;
	}